

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

void __thiscall Epoll::epoll_add(Epoll *this,int fd,int event,EventCallback *cb)

{
  ulong uVar1;
  int iVar2;
  _Hash_node_base *p_Var3;
  mapped_type *pmVar4;
  Logger *pLVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  long lVar9;
  ulong uVar10;
  int fd_local;
  epoll_event ev;
  
  uVar10 = (ulong)(uint)event;
  uVar1 = (this->ep_event_map)._M_h._M_bucket_count;
  uVar6 = (ulong)(long)fd % uVar1;
  p_Var7 = (this->ep_event_map)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, *(int *)&p_Var7->_M_nxt[1]._M_nxt != fd)) {
    while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, *(int *)&p_Var3[1]._M_nxt == fd)) goto LAB_0010923e;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0010923e:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var8->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    iVar2 = 1;
  }
  else {
    uVar10 = (ulong)(*(uint *)&p_Var3[2]._M_nxt | event);
    iVar2 = 3;
  }
  lVar9 = 8;
  fd_local = fd;
  if (((event & 1U) != 0) || (lVar9 = 0x28, (event & 4U) != 0)) {
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->ep_event_map,&fd_local);
    std::function<void_()>::operator=((function<void_()> *)((long)&pmVar4->event + lVar9),cb);
  }
  pmVar4 = std::__detail::
           _Map_base<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->ep_event_map,&fd_local);
  ev.events = (uint32_t)uVar10;
  pmVar4->event = ev.events;
  ev.data.fd = fd_local;
  iVar2 = epoll_ctl(this->ep_epoll_fd,iVar2,fd_local,(epoll_event *)&ev);
  if (iVar2 == -1) {
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] epoll ctl error for fd %d\n","error","epoll_add",0x2e,
             (ulong)(uint)fd_local);
    }
  }
  else {
    pLVar5 = Logger::get_instance();
    if ((pLVar5->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","epoll_add",0x31);
    }
    if (1 < (int)g_log_level) {
      pLVar5 = Logger::get_instance();
      Logger::write_log(pLVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/epoll.cpp"
                        ,"epoll_add",0x31,LOG_LEVEL_INFO,"epoll add, fd is %d, event is %d\n",
                        (ulong)(uint)fd_local,uVar10);
      pLVar5 = Logger::get_instance();
      Logger::flush(pLVar5);
    }
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->ep_listen_fds,&fd_local);
  }
  return;
}

Assistant:

void Epoll::epoll_add(int fd, int event, const EventCallback& cb) {
    int final_events;
    int op;

    if (auto ret = ep_event_map.find(fd); ret == ep_event_map.end()) {
        final_events = event;    
        op = EPOLL_CTL_ADD;
    }
    else {
        final_events = ret->second.event | event;
        op = EPOLL_CTL_MOD;
    }

    if (event & EPOLLIN) {
        ep_event_map[fd].read_callback = cb;
    }
    else if (event & EPOLLOUT) {
        ep_event_map[fd].write_callback = cb;
    }
    
    ep_event_map[fd].event = final_events;

    struct epoll_event ev;
    ev.events = final_events;
    ev.data.fd = fd;
    if (epoll_ctl(ep_epoll_fd, op, fd, &ev) == -1) {
        PR_ERROR("epoll ctl error for fd %d\n", fd);
        return;
    }
LOG_INFO("epoll add, fd is %d, event is %d\n", fd, final_events);
    ep_listen_fds.insert(fd);
}